

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.cxx
# Opt level: O1

int __thiscall Fl_Tree_Item::swap_children(Fl_Tree_Item *this,Fl_Tree_Item *a,Fl_Tree_Item *b)

{
  Fl_Tree_Item *pFVar1;
  Fl_Tree_Item **ppFVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  
  uVar6 = (ulong)(this->_children)._total;
  iVar3 = -1;
  iVar5 = -1;
  uVar4 = 0xffffffff;
  iVar7 = -1;
  if (0 < (long)uVar6) {
    uVar8 = 0;
    do {
      pFVar1 = (this->_children)._items[uVar8];
      iVar7 = (int)uVar8;
      if (pFVar1 == a) {
        iVar5 = iVar7;
        iVar7 = (int)uVar4;
        if ((int)uVar4 != -1) break;
        uVar4 = 0xffffffff;
      }
      else if (pFVar1 == b) {
        if (iVar5 != -1) break;
        uVar4 = uVar8 & 0xffffffff;
        iVar5 = -1;
      }
      iVar7 = (int)uVar4;
      uVar8 = uVar8 + 1;
    } while (uVar6 != uVar8);
  }
  if (iVar7 != -1 && iVar5 != -1) {
    ppFVar2 = (this->_children)._items;
    pFVar1 = ppFVar2[iVar5];
    ppFVar2[iVar5] = ppFVar2[iVar7];
    (this->_children)._items[iVar7] = pFVar1;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int Fl_Tree_Item::swap_children(Fl_Tree_Item *a, Fl_Tree_Item *b) {
  int ax = -1, bx = -1;
  for ( int t=0; t<children(); t++ ) {	// find index for a and b
    if ( _children[t] == a ) { ax = t; if ( bx != -1 ) break; else continue; }
    if ( _children[t] == b ) { bx = t; if ( ax != -1 ) break; else continue; }
  }
  if ( ax == -1 || bx == -1 ) return(-1);	// not found? fail
  swap_children(ax,bx);
  return(0);
}